

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_perlin.h
# Opt level: O0

float stb_perlin_ridge_noise3
                (float x,float y,float z,float lacunarity,float gain,float offset,int octaves)

{
  float fVar1;
  undefined4 local_38;
  float r;
  float sum;
  float amplitude;
  float prev;
  float frequency;
  int i;
  int octaves_local;
  float offset_local;
  float gain_local;
  float lacunarity_local;
  float z_local;
  float y_local;
  float x_local;
  
  amplitude = 1.0;
  sum = 1.0;
  r = 0.5;
  local_38 = 0.0;
  for (prev = 0.0; (int)prev < octaves; prev = (float)((int)prev + 1)) {
    fVar1 = stb_perlin_noise3_internal
                      (x * amplitude,y * amplitude,z * amplitude,0,0,0,SUB41(prev,0));
    fVar1 = (offset - ABS(fVar1)) * (offset - ABS(fVar1));
    local_38 = fVar1 * r * sum + local_38;
    amplitude = lacunarity * amplitude;
    r = gain * r;
    sum = fVar1;
  }
  return local_38;
}

Assistant:

float stb_perlin_ridge_noise3(float x, float y, float z, float lacunarity, float gain, float offset, int octaves)
{
   int i;
   float frequency = 1.0f;
   float prev = 1.0f;
   float amplitude = 0.5f;
   float sum = 0.0f;

   for (i = 0; i < octaves; i++) {
      float r = stb_perlin_noise3_internal(x*frequency,y*frequency,z*frequency,0,0,0,(unsigned char)i);
      r = offset - (float) fabs(r);
      r = r*r;
      sum += r*amplitude*prev;
      prev = r;
      frequency *= lacunarity;
      amplitude *= gain;
   }
   return sum;
}